

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O2

void transassn(quadtype nextquad)

{
  char source [10];
  char target [10];
  
  getlabel(nextquad.op1.opnd,target);
  getlabel(nextquad.op2.opnd,source);
  fwrite("; ",2,1,(FILE *)ofp);
  fprintlexeme(ofp,nextquad.op1.opnd);
  fwrite(" := ",4,1,(FILE *)ofp);
  fprintlexeme(ofp,nextquad.op2.opnd);
  fputc(10,(FILE *)ofp);
  emitfromone(opcmov,"ax",nextquad.op2.opnd);
  emittoone(opcmov,nextquad.op1.opnd,"ax");
  return;
}

Assistant:

void    transassn(struct quadtype nextquad)
{
    char    target[LABELSIZE], source[LABELSIZE];
    getlabel(nextquad.op1.opnd, target);
    getlabel(nextquad.op2.opnd, source);
    fprintf(ofp, "; ");
    fprintlexeme(ofp, nextquad.op1.opnd);
    fprintf(ofp, " := ");
    fprintlexeme(ofp, nextquad.op2.opnd);
    fprintf(ofp, "\n");
    
    emitfromone(opcmov, "ax", nextquad.op2.opnd);
    emittoone(opcmov, nextquad.op1.opnd, "ax");
    
    
}